

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream_capture.hpp
# Opt level: O1

void __thiscall iutest::detail::IUStreamCapture::Close(IUStreamCapture *this)

{
  if (this->m_prev_fd != -1) {
    dup2(this->m_prev_fd,this->m_fd);
    close(this->m_prev_fd);
    this->m_prev_fd = -1;
    this->m_new_fd = -1;
  }
  return;
}

Assistant:

void Close()
    {
        if( m_prev_fd != -1 )
        {
            internal::posix::Dup2(m_prev_fd, m_fd);
            internal::posix::FdClose(m_prev_fd);
            m_prev_fd = -1;
            m_new_fd = -1;
        }
    }